

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dagify.cpp
# Opt level: O1

unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
* handlegraph::algorithms::dagify_from
            (unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
             *__return_storage_ptr__,HandleGraph *graph,
            vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *start_handles,
            DeletableHandleGraph *into,size_t min_preserved_path_length)

{
  pointer phVar1;
  iterator __position;
  pointer plVar2;
  undefined8 uVar3;
  HandleGraph *pHVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  size_type sVar7;
  vector<long_long,std::allocator<long_long>> *this;
  undefined4 extraout_var_00;
  mapped_type *pmVar8;
  MutableHandleGraph *into_00;
  handle_t *h;
  pointer phVar9;
  undefined8 uVar10;
  _Hash_node_base *p_Var11;
  handle_t *h_1;
  longlong *new_id;
  pointer plVar12;
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  *new_id_to_old_id;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> into_start_handles;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> to_remove;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  visited_nodes;
  unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  start_id_to_new_ids;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  start_nodes;
  DeletableHandleGraph *local_1a0;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_198;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  HandleGraph *local_150;
  _Any_data local_148;
  _Any_data *local_138;
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  *puStack_130;
  pointer local_120;
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_118;
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_d8;
  _Hashtable<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  if (into == (DeletableHandleGraph *)0x0) {
    into_00 = (MutableHandleGraph *)0x0;
  }
  else {
    into_00 = (MutableHandleGraph *)(&into->field_0x0 + *(long *)((long)*into + -0x110));
  }
  local_1a0 = into;
  local_150 = graph;
  dagify(__return_storage_ptr__,graph,into_00,min_preserved_path_length);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  phVar9 = (start_handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  phVar1 = (start_handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (phVar9 != phVar1) {
    do {
      iVar5 = (*local_150->_vptr_HandleGraph[4])(local_150,phVar9);
      local_d8._M_buckets = (__buckets_ptr)CONCAT44(extraout_var,iVar5);
      local_a0._M_buckets = (__buckets_ptr)&local_68;
      std::
      _Hashtable<long_long,long_long,std::allocator<long_long>,std::__detail::_Identity,std::equal_to<long_long>,std::hash<long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<long_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long_long,false>>>>
                ((_Hashtable<long_long,long_long,std::allocator<long_long>,std::__detail::_Identity,std::equal_to<long_long>,std::hash<long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_68,&local_d8,&local_a0);
      phVar9 = phVar9 + 1;
    } while (phVar9 != phVar1);
  }
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  p_Var11 = (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt;
  if (p_Var11 != (_Hash_node_base *)0x0) {
    do {
      sVar7 = std::
              _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&local_68,(key_type *)(p_Var11 + 2));
      if (sVar7 != 0) {
        this = (vector<long_long,std::allocator<long_long>> *)
               std::__detail::
               _Map_base<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_a0,(key_type *)(p_Var11 + 2));
        __position._M_current = *(longlong **)(this + 8);
        if (__position._M_current == *(longlong **)(this + 0x10)) {
          std::vector<long_long,std::allocator<long_long>>::_M_realloc_insert<long_long_const&>
                    (this,__position,(longlong *)(p_Var11 + 1));
        }
        else {
          *__position._M_current = (longlong)p_Var11[1]._M_nxt;
          *(longlong **)(this + 8) = __position._M_current + 1;
        }
      }
      p_Var11 = p_Var11->_M_nxt;
    } while (p_Var11 != (_Hash_node_base *)0x0);
  }
  local_198.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (handle_t *)0x0;
  local_198.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (handle_t *)0x0;
  phVar9 = (start_handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_120 = (start_handles->
              super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  if (phVar9 != local_120) {
    do {
      pHVar4 = local_150;
      iVar5 = (*local_150->_vptr_HandleGraph[4])(local_150,phVar9);
      local_d8._M_buckets = (__buckets_ptr)CONCAT44(extraout_var_00,iVar5);
      uVar6 = (*pHVar4->_vptr_HandleGraph[5])(pHVar4,phVar9);
      pmVar8 = std::__detail::
               _Map_base<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_a0,(key_type *)&local_d8);
      plVar2 = (pmVar8->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (plVar12 = (pmVar8->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start; plVar12 != plVar2; plVar12 = plVar12 + 1) {
        local_118._M_buckets =
             (__buckets_ptr)
             (**(code **)(*(long *)((long)&local_1a0->field_0x0 +
                                   *(long *)((long)*local_1a0 + -0xb0)) + 0x18))
                       ((long)&local_1a0->field_0x0 + *(long *)((long)*local_1a0 + -0xb0),plVar12,
                        uVar6 & 0xff);
        if (local_198.
            super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_198.
            super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::
          _M_realloc_insert<handlegraph::handle_t>
                    (&local_198,
                     (iterator)
                     local_198.
                     super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(handle_t *)&local_118);
        }
        else {
          *(__buckets_ptr *)
           (local_198.
            super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
            _M_impl.super__Vector_impl_data._M_finish)->data = local_118._M_buckets;
          local_198.
          super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_198.
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      phVar9 = phVar9 + 1;
    } while (phVar9 != local_120);
  }
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  puStack_130 = (unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                 *)std::
                   _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dagify.cpp:520:9)>
                   ::_M_invoke;
  local_138 = (_Any_data *)
              std::
              _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dagify.cpp:520:9)>
              ::_M_manager;
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_160 = std::
              _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dagify.cpp:525:9)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dagify.cpp:525:9)>
              ::_M_manager;
  local_118._M_buckets = &local_118._M_single_bucket;
  local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_118._M_element_count = 0;
  local_118._M_bucket_count = 1;
  local_118._M_rehash_policy._M_max_load_factor = 1.0;
  local_118._M_rehash_policy._4_4_ = 0;
  local_118._M_rehash_policy._M_next_resize = 0;
  local_118._M_single_bucket = (__node_base_ptr)0x0;
  local_148._M_unused._M_object = &local_d8;
  local_148._8_8_ = &local_1a0;
  internal::dfs((HandleGraph *)((long)&local_1a0->field_0x0 + *(long *)((long)*local_1a0 + -0xb0)),
                (function<void_(const_handlegraph::handle_t_&)> *)&local_148,
                (function<void_(const_handlegraph::handle_t_&)> *)&local_178,&local_198,
                (unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                 *)&local_118);
  std::
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_118);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  if (local_138 != (_Any_data *)0x0) {
    (*(code *)local_138)(&local_148,&local_148,__destroy_functor);
  }
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = (_func_void *)0x0;
  local_168 = (code *)0x0;
  local_118._M_bucket_count = 0;
  local_118._M_element_count =
       (size_type)
       std::
       _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
       ::_M_invoke;
  local_118._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
       ::_M_manager;
  local_148._M_unused._M_object = &local_1a0;
  local_148._8_8_ = &local_d8;
  local_138 = &local_178;
  puStack_130 = __return_storage_ptr__;
  local_118._M_buckets = (__buckets_ptr)&local_148;
  (**(code **)(*(long *)((long)&local_1a0->field_0x0 + *(long *)((long)*local_1a0 + -0xb0)) + 0x98))
            ((long)&local_1a0->field_0x0 + *(long *)((long)*local_1a0 + -0xb0),&local_118,0);
  uVar10 = local_178._M_unused._0_8_;
  uVar3 = local_178._8_8_;
  if (local_118._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)local_118._M_before_begin._M_nxt)(&local_118,&local_118,3);
    uVar10 = local_178._M_unused._0_8_;
    uVar3 = local_178._8_8_;
  }
  for (; uVar10 != uVar3; uVar10 = (_func_void *)(uVar10 + 8)) {
    (**(code **)((long)*local_1a0 + 0xf8))(local_1a0,uVar10);
  }
  if ((_func_void *)local_178._M_unused._0_8_ != (_func_void *)0x0) {
    operator_delete(local_178._M_unused._M_object,(long)local_168 - local_178._0_8_);
  }
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_d8);
  if (local_198.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<nid_t, nid_t> dagify_from(const HandleGraph* graph,
                                             std::vector<handle_t> start_handles,
                                             DeletableHandleGraph* into,
                                             size_t min_preserved_path_length) {
    
    // Cheating implementation
    
    // Dagify the *entire* graph, creating some nodes not reachable from the starting points.
    auto new_id_to_old_id = dagify(graph, into, min_preserved_path_length);
    
    // Find all the node IDs we have start handles on
    std::unordered_set<nid_t> start_nodes;
    for (auto& h : start_handles) {
        start_nodes.insert(graph->get_id(h));
    }
    
    // Invert enough of the ID mapping so we can translate our start handles
    std::unordered_map<nid_t, std::vector<nid_t>> start_id_to_new_ids;
    for (auto& kv : new_id_to_old_id) {
        if (start_nodes.count(kv.second)) {
            start_id_to_new_ids[kv.second].push_back(kv.first);
        }
    }
    
    // Translate all our start handles into the into graph.
    std::vector<handle_t> into_start_handles;
    for (auto& h : start_handles) {
        auto id = graph->get_id(h);
        auto is_rev = graph->get_is_reverse(h);
        for (auto& new_id : start_id_to_new_ids[id]) {
            // We know the orientations of the duplicated nodes are the same, so we just pass orientation along.
            into_start_handles.push_back(into->get_handle(new_id, is_rev));
        }
    }
    
    // Tag all the nodes we can reach on oriented walks from the starting
    // handles' copies.
    std::unordered_set<nid_t> visited_nodes;
    handlegraph::algorithms::internal::dfs(
        *into,
        [&](const handle_t& h) -> void {
            // Called when node orientation is first encountered.
            // Mark the node as reachable.
            visited_nodes.insert(into->get_id(h));
        },
        [](const handle_t& ignored) -> void {},
        into_start_handles,
        {}
    );
    
    // TODO: We're supposed to be able to destroy the current handle as we loop
    // over it, but HashGraph can't handle that.
    std::vector<handle_t> to_remove;
    into->for_each_handle([&](const handle_t& h) {
        auto node_id = into->get_id(h);
        if (!visited_nodes.count(node_id)) {
            // Destroy each handle not visited on such a walk.
            to_remove.push_back(h);
            // And the translation from it
            new_id_to_old_id.erase(node_id);
        }
    });
    for (auto& h : to_remove) {
         into->destroy_handle(h);
    }
    
    return new_id_to_old_id;
}